

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O3

void WriteDDintoBLIFfile(FILE *pFile,DdNode *Func,char *OutputName,char *Prefix,char **InputNames)

{
  char *pcVar1;
  FILE *pFVar2;
  st__generator *psVar3;
  st__generator *psVar4;
  int iVar5;
  st__table *visited;
  st__generator *psVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  DdNode *Node;
  FILE *local_60;
  char *local_58;
  st__generator *local_50;
  st__table *local_48;
  char **local_40;
  int *pSlot;
  
  local_60 = (FILE *)pFile;
  local_58 = Prefix;
  local_50 = (st__generator *)OutputName;
  local_40 = InputNames;
  visited = st__init_table(st__ptrcmp,st__ptrhash);
  cuddCollectNodes((DdNode *)((ulong)Func & 0xfffffffffffffffe),visited);
  local_48 = visited;
  psVar6 = st__init_gen(visited);
  iVar5 = st__gen(psVar6,(char **)&Node,(char **)0x0);
  uVar11 = 0;
  if (iVar5 != 0) {
    uVar11 = 0;
    do {
      uVar11 = uVar11 | (ulong)Node ^ (ulong)Func & 0xfffffffffffffffe;
      iVar5 = st__gen(psVar6,(char **)&Node,(char **)0x0);
    } while (iVar5 != 0);
  }
  st__free_gen(psVar6);
  pFVar2 = local_60;
  uVar8 = 0;
  do {
    uVar9 = ~(-1 << ((byte)uVar8 & 0x1f));
    if ((long)uVar11 <= (long)(ulong)uVar9) break;
    bVar12 = uVar8 < 0x3c;
    uVar8 = uVar8 + 4;
  } while (bVar12);
  fprintf(local_60,".names %s%lx %s\n",local_58,(ulong)((uint)Func & uVar9) * 0x66666667 >> 0x24,
          local_50);
  pcVar7 = "0";
  if (((ulong)Func & 1) == 0) {
    pcVar7 = "1";
  }
  fprintf(pFVar2,"%s 1\n",pcVar7);
  psVar6 = st__init_gen(local_48);
  iVar5 = st__gen(psVar6,(char **)&Node,(char **)0x0);
  psVar4 = psVar6;
  pFVar2 = local_60;
  psVar3 = local_50;
  do {
    local_50 = psVar4;
    local_60 = pFVar2;
    if (iVar5 == 0) {
      local_50 = psVar3;
      st__free_gen(psVar6);
      st__free_table(local_48);
      return;
    }
    uVar8 = (uint)Node;
    if ((ulong)Node->index == 0x7fffffff) {
      fprintf(pFVar2,".names %s%lx\n",local_58,(ulong)(uVar8 & uVar9) / 0x28);
      pcVar7 = "0";
      if ((Node->type).value != 0.0) {
        pcVar7 = "1";
      }
      if (NAN((Node->type).value)) {
        pcVar7 = "1";
      }
      fprintf(pFVar2," %s\n",pcVar7);
    }
    else {
      pcVar7 = local_40[Node->index];
      if (pcVar7 == (char *)0x0) {
        __assert_fail("InputNames[Node->index]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                      ,0x376,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)");
      }
      pcVar1 = *(char **)((long)&Node->type + 8);
      uVar10 = (uint)*(undefined8 *)&Node->type;
      if (pcVar1 == (char *)((ulong)pcVar1 & 0xfffffffffffffffe)) {
        fprintf(pFVar2,".names %s %s%lx %s%lx %s%lx\n",pcVar7,local_58,
                (ulong)((uint)pcVar1 & uVar9) / 0x28,local_58,(ulong)(uVar10 & uVar9) / 0x28,
                local_58,(ulong)(uVar8 & uVar9) / 0x28);
        fwrite("01- 1\n",6,1,pFVar2);
        fwrite("1-1 1\n",6,1,pFVar2);
      }
      else {
        uVar11 = (ulong)((uint)pcVar1 & uVar9) / 0x28;
        fprintf(pFVar2,".names %s %s%lx_i %s%lx %s%lx\n",pcVar7,local_58,uVar11,local_58,
                (ulong)(uVar10 & uVar9) / 0x28,local_58,(ulong)(uVar8 & uVar9) / 0x28);
        fwrite("01- 1\n",6,1,pFVar2);
        fwrite("1-1 1\n",6,1,pFVar2);
        iVar5 = st__find(local_48,(char *)((ulong)pcVar1 & 0xfffffffffffffffe),(char ***)&pSlot);
        pFVar2 = local_60;
        if (iVar5 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cas/casCore.c"
                        ,0x38c,"void WriteDDintoBLIFfile(FILE *, DdNode *, char *, char *, char **)"
                       );
        }
        psVar6 = local_50;
        if (*pSlot == 0) {
          *pSlot = 1;
          fprintf(local_60,".names %s%lx %s%lx_i\n",local_58,uVar11,local_58,uVar11);
          fwrite("0 1\n",4,1,pFVar2);
          psVar6 = local_50;
        }
      }
    }
    iVar5 = st__gen(psVar6,(char **)&Node,(char **)0x0);
    psVar4 = local_50;
    pFVar2 = local_60;
    psVar3 = local_50;
  } while( true );
}

Assistant:

void WriteDDintoBLIFfile( FILE * pFile, DdNode * Func, char * OutputName, char * Prefix, char ** InputNames )
// writes the main part of the BLIF file 
// Func is a BDD or a 0-1 ADD to be written
// OutputName is the name of the output
// Prefix is attached to each intermendiate signal to make it unique
// InputNames are the names of the input signals
// (some part of the code is borrowed from Cudd_DumpDot())
{
    int i;
    st__table * visited;
    st__generator * gen = NULL;
    long refAddr, diff, mask;
    DdNode * Node, * Else, * ElseR, * Then;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash );

    /* Collect all the nodes of this DD in the symbol table. */
    cuddCollectNodes( Cudd_Regular(Func), visited );

    /* Find how many most significant hex digits are identical
       ** in the addresses of all the nodes. Build a mask based
       ** on this knowledge, so that digits that carry no information
       ** will not be printed. This is done in two steps.
       **  1. We scan the symbol table to find the bits that differ
       **     in at least 2 addresses.
       **  2. We choose one of the possible masks. There are 8 possible
       **     masks for 32-bit integer, and 16 possible masks for 64-bit
       **     integers.
     */

    /* Find the bits that are different. */
    refAddr = ( long )Cudd_Regular(Func);
    diff = 0;
    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        diff |= refAddr ^ ( long ) Node;
    }
    st__free_gen( gen );
    gen = NULL;

    /* Choose the mask. */
    for ( i = 0; ( unsigned ) i < 8 * sizeof( long ); i += 4 )
    {
        mask = ( 1 << i ) - 1;
        if ( diff <= mask )
            break;
    }


    // write the buffer for the output
    fprintf( pFile, ".names %s%lx %s\n", Prefix, ( mask & (long)Cudd_Regular(Func) ) / sizeof(DdNode), OutputName ); 
    fprintf( pFile, "%s 1\n", (Cudd_IsComplement(Func))? "0": "1" );


    gen = st__init_gen( visited );
    while ( st__gen( gen, ( const char ** ) &Node, NULL ) )
    {
        if ( Node->index == CUDD_MAXINDEX )
        {
            // write the terminal node
            fprintf( pFile, ".names %s%lx\n", Prefix, ( mask & (long)Node ) / sizeof(DdNode) );
            fprintf( pFile, " %s\n", (cuddV(Node) == 0.0)? "0": "1" );
            continue;
        }

        Else  = cuddE(Node);
        ElseR = Cudd_Regular(Else);
        Then  = cuddT(Node);

        assert( InputNames[Node->index] );
        if ( Else == ElseR )
        { // no inverter
            fprintf( pFile, ".names %s %s%lx %s%lx %s%lx\n", InputNames[Node->index],                           
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );
        }
        else
        { // inverter
            int * pSlot;
            fprintf( pFile, ".names %s %s%lx_i %s%lx %s%lx\n", InputNames[Node->index],                         
                              Prefix, ( mask & (long)ElseR ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Then  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)Node  ) / sizeof(DdNode)   );
            fprintf( pFile, "01- 1\n" );
            fprintf( pFile, "1-1 1\n" );

            // if the inverter is written, skip
            if ( ! st__find( visited, (char *)ElseR, (char ***)&pSlot ) )
                assert( 0 );
            if ( *pSlot )
                continue;
            *pSlot = 1;

            fprintf( pFile, ".names %s%lx %s%lx_i\n",  
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode),
                              Prefix, ( mask & (long)ElseR  ) / sizeof(DdNode)   );
            fprintf( pFile, "0 1\n" );
        }
    }
    st__free_gen( gen );
    gen = NULL;
    st__free_table( visited );
}